

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas0.cpp
# Opt level: O1

complex<double> * c8mat_uniform_01_new(int m,int n,int *seed)

{
  int iVar1;
  int iVar2;
  complex<double> *__s;
  int iVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  
  iVar1 = n * m;
  uVar5 = 0xffffffffffffffff;
  if (-1 < iVar1) {
    uVar5 = (long)iVar1 << 4;
  }
  __s = (complex<double> *)operator_new__(uVar5);
  if (iVar1 != 0) {
    memset(__s,0,(long)iVar1 << 4);
  }
  if (0 < n) {
    lVar6 = (long)__s->_M_value + 8;
    uVar5 = 0;
    do {
      if (0 < m) {
        lVar4 = 0;
        do {
          iVar1 = (*seed % 0x1f31d) * 0x41a7;
          iVar3 = (*seed / 0x1f31d) * -0xb14;
          iVar2 = iVar1 + iVar3;
          iVar1 = iVar1 + iVar3 + 0x7fffffff;
          if (-1 < iVar2) {
            iVar1 = iVar2;
          }
          *seed = iVar1;
          dVar7 = (double)iVar1 * 4.656612875e-10;
          if (dVar7 < 0.0) {
            dVar7 = sqrt(dVar7);
          }
          else {
            dVar7 = SQRT(dVar7);
          }
          iVar1 = (*seed % 0x1f31d) * 0x41a7;
          iVar3 = (*seed / 0x1f31d) * -0xb14;
          iVar2 = iVar1 + iVar3;
          iVar1 = iVar1 + iVar3 + 0x7fffffff;
          if (-1 < iVar2) {
            iVar1 = iVar2;
          }
          *seed = iVar1;
          dVar8 = (double)iVar1 * 4.656612875e-10 * 6.283185307179586;
          dVar9 = cos(dVar8);
          dVar8 = sin(dVar8);
          *(double *)(lVar6 + lVar4 + -8) = dVar9 * dVar7;
          *(double *)(lVar6 + lVar4) = dVar8 * dVar7;
          lVar4 = lVar4 + 0x10;
        } while ((ulong)(uint)m * 0x10 != lVar4);
      }
      uVar5 = uVar5 + 1;
      lVar6 = lVar6 + (ulong)(uint)m * 0x10;
    } while (uVar5 != (uint)n);
  }
  return __s;
}

Assistant:

complex <double> *c8mat_uniform_01_new ( int m, int n, int &seed )

//****************************************************************************80
//
//  Purpose:
//
//    C8MAT_UNIFORM_01_NEW returns a unit pseudorandom C8MAT.
//
//  Discussion:
//
//    A C8MAT is an array of complex <double> values.
//
//    The angles should be uniformly distributed between 0 and 2 * PI,
//    the square roots of the radius uniformly distributed between 0 and 1.
//
//    This results in a uniform distribution of values in the unit circle.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    15 March 2005
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int M, N, the number of rows and columns in the matrix.
//
//    Input/output, int &SEED, the "seed" value, which should NOT be 0.
//    On output, SEED has been updated.
//
//    Output, complex <double> C8MAT_UNIFORM_01_NEW[M*N], the pseudorandom 
//    complex matrix.
//
{
  complex <double> *c;
  int i;
  int j;
  double r;
  int k;
  const double r8_pi = 3.141592653589793;
  double theta;

  c = new complex <double> [m*n];

  for ( j = 0; j < n; j++ )
  {
    for ( i = 0; i < m; i++ )
    {
      k = seed / 127773;

      seed = 16807 * ( seed - k * 127773 ) - k * 2836;

      if ( seed < 0 )
      {
        seed = seed + 2147483647;
      }

      r = sqrt ( static_cast<double>(seed) * 4.656612875E-10 );

      k = seed / 127773;

      seed = 16807 * ( seed - k * 127773 ) - k * 2836;

      if ( seed < 0 )
      {
        seed = seed + 2147483647;
      }

      theta = 2.0 * r8_pi * ( static_cast<double>(seed) * 4.656612875E-10 );

      c[i+j*m] = r * complex <double> ( cos ( theta ), sin ( theta ) );
    }
  }
  return c;
}